

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawImageObjectUtil.cpp
# Opt level: O3

void vkt::Draw::transition2DImage
               (DeviceInterface *vk,VkCommandBuffer cmdBuffer,VkImage image,
               VkImageAspectFlags aspectMask,VkImageLayout oldLayout,VkImageLayout newLayout,
               VkAccessFlags srcAccessMask,VkAccessFlags dstAccessMask)

{
  undefined4 local_50 [2];
  undefined8 local_48;
  VkAccessFlags local_40;
  VkAccessFlags local_3c;
  VkImageLayout local_38;
  VkImageLayout local_34;
  undefined8 local_30;
  deUint64 local_28;
  VkImageAspectFlags local_20;
  undefined4 local_1c;
  undefined4 uStack_18;
  undefined4 uStack_14;
  undefined4 uStack_10;
  
  local_50[0] = 0x2d;
  local_48 = 0;
  local_40 = srcAccessMask;
  local_3c = dstAccessMask;
  local_30 = 0xffffffffffffffff;
  local_1c = 0;
  uStack_18 = 1;
  uStack_14 = 0;
  uStack_10 = 1;
  local_38 = oldLayout;
  local_34 = newLayout;
  local_28 = image.m_internal;
  local_20 = aspectMask;
  (*vk->_vptr_DeviceInterface[0x6d])(vk,cmdBuffer,0x8000,1,0,0,0,0,0,1,local_50);
  return;
}

Assistant:

void transition2DImage (const vk::DeviceInterface&	vk,
						vk::VkCommandBuffer			cmdBuffer,
						vk::VkImage					image,
						vk::VkImageAspectFlags		aspectMask,
						vk::VkImageLayout			oldLayout,
						vk::VkImageLayout			newLayout,
						vk::VkAccessFlags			srcAccessMask,
						vk::VkAccessFlags			dstAccessMask)
{
	vk::VkImageMemoryBarrier barrier;
	barrier.sType							= vk::VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER;
	barrier.pNext							= DE_NULL;
	barrier.srcAccessMask					= srcAccessMask;
	barrier.dstAccessMask					= dstAccessMask;
	barrier.oldLayout						= oldLayout;
	barrier.newLayout						= newLayout;
	barrier.srcQueueFamilyIndex				= VK_QUEUE_FAMILY_IGNORED;
	barrier.dstQueueFamilyIndex				= VK_QUEUE_FAMILY_IGNORED;
	barrier.image							= image;
	barrier.subresourceRange.aspectMask		= aspectMask;
	barrier.subresourceRange.baseMipLevel	= 0;
	barrier.subresourceRange.levelCount		= 1;
	barrier.subresourceRange.baseArrayLayer = 0;
	barrier.subresourceRange.layerCount		= 1;

	vk.cmdPipelineBarrier(cmdBuffer, vk::VK_PIPELINE_STAGE_ALL_GRAPHICS_BIT, vk::VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT, (vk::VkDependencyFlags)0,
						  0, (const vk::VkMemoryBarrier*)DE_NULL,
						  0, (const vk::VkBufferMemoryBarrier*)DE_NULL,
						  1, &barrier);
}